

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void utrie_compact(UNewTrie *trie,UBool overlap,UErrorCode *pErrorCode)

{
  int32_t *__s;
  char cVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint32_t *puVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint32_t *puVar14;
  long lVar15;
  int iVar16;
  
  if (0 < (int)pErrorCode) {
    return;
  }
  if (trie->isCompacted == '\0') {
    __s = trie->map;
    memset(__s,0xff,0x22084);
    iVar13 = trie->indexLength;
    if (0 < (long)iVar13) {
      lVar4 = 0;
      do {
        uVar3 = trie->index[lVar4];
        uVar11 = -uVar3;
        if (0 < (int)uVar3) {
          uVar11 = uVar3;
        }
        trie->map[uVar11 >> 5] = 0;
        lVar4 = lVar4 + 1;
      } while (iVar13 != lVar4);
    }
    trie->map[0] = 0;
    cVar1 = trie->isLatin1Linear;
    iVar13 = trie->dataLength;
    uVar3 = 0x20;
    if (0x20 < iVar13) {
      lVar4 = 4;
      if (overlap == '\0') {
        lVar4 = 0x20;
      }
      uVar3 = 0x20;
      uVar11 = 0x20;
      do {
        lVar12 = (long)(int)uVar11 << 2;
LAB_00111e56:
        iVar5 = (int)uVar11 >> 5;
        if (__s[iVar5] < 0) goto LAB_00111ec2;
        if ((int)uVar11 < (int)((uint)(cVar1 != '\0') << 8 | 0x20)) goto LAB_00111f58;
        puVar6 = trie->data;
        if (0x1f < (int)uVar3) {
          lVar15 = 0;
          uVar10 = 0;
          do {
            uVar7 = 0x21;
            puVar14 = puVar6;
            while (*(uint32_t *)((long)puVar14 + lVar15) == puVar14[uVar11]) {
              uVar7 = uVar7 - 1;
              puVar14 = puVar14 + 1;
              if (uVar7 < 2) {
                trie->map[iVar5] = (int32_t)uVar10;
                iVar13 = trie->dataLength;
                goto LAB_00111ec2;
              }
            }
            uVar10 = uVar10 + lVar4;
            lVar15 = lVar15 + (ulong)(uint)((int)lVar4 * 4);
          } while (uVar10 <= uVar3 - 0x20);
        }
        if (overlap == '\0') {
LAB_00111f58:
          if ((int)uVar3 < (int)uVar11) {
            trie->map[iVar5] = uVar3;
            puVar6 = trie->data;
            lVar15 = 0;
            iVar13 = 0;
            do {
              *(undefined4 *)((long)puVar6 + lVar15 + (long)(int)uVar3 * 4) =
                   *(undefined4 *)((long)puVar6 + lVar15 + lVar12);
              lVar15 = lVar15 + 4;
              iVar5 = iVar13 + -1;
              uVar7 = iVar13 + 0x20;
              iVar13 = iVar5;
            } while (1 < uVar7);
            uVar3 = uVar3 - iVar5;
            uVar11 = uVar11 - iVar5;
          }
          else {
            __s[iVar5] = uVar11;
            uVar3 = uVar3 + 0x20;
            uVar11 = uVar3;
          }
        }
        else {
          iVar13 = uVar11 + 0x1c;
          lVar15 = (long)(int)uVar3 * 4 + -0x70;
          iVar9 = 0x1d;
          iVar16 = 5;
          puVar14 = puVar6;
          uVar10 = 0x1c;
          iVar8 = iVar9;
          do {
            while (*(uint32_t *)((long)puVar14 + lVar15) != puVar14[uVar11]) {
              iVar13 = iVar13 + -4;
              iVar9 = iVar8 + -4;
              lVar15 = lVar15 + 0x10;
              iVar16 = iVar16 + 4;
              bVar2 = uVar10 < 5;
              puVar14 = puVar6;
              uVar10 = uVar10 - 4;
              iVar8 = iVar9;
              if (bVar2) goto LAB_00111f58;
            }
            iVar9 = iVar9 + -1;
            puVar14 = puVar14 + 1;
          } while (1 < iVar9);
          __s[iVar5] = uVar3 - (int)uVar10;
          if ((long)uVar10 < 0x20) {
            iVar5 = 0;
            do {
              puVar6[(int)uVar3] = puVar6[iVar13];
              puVar6 = puVar6 + 1;
              iVar5 = iVar5 + -1;
              iVar16 = iVar16 + -1;
            } while (1 < iVar16);
            uVar3 = uVar3 - iVar5;
            uVar11 = iVar13 - iVar5;
          }
          else {
            uVar11 = uVar11 + (int)uVar10;
          }
        }
        iVar13 = trie->dataLength;
        if (iVar13 <= (int)uVar11) break;
      } while( true );
    }
LAB_00111ffe:
    if (0 < trie->indexLength) {
      lVar4 = 0;
      do {
        uVar11 = trie->index[lVar4];
        uVar7 = -uVar11;
        if (0 < (int)uVar11) {
          uVar7 = uVar11;
        }
        trie->index[lVar4] = trie->map[uVar7 >> 5];
        lVar4 = lVar4 + 1;
      } while (lVar4 < trie->indexLength);
    }
    trie->dataLength = uVar3;
  }
  return;
LAB_00111ec2:
  uVar11 = uVar11 + 0x20;
  lVar12 = lVar12 + 0x80;
  if (iVar13 <= (int)uVar11) goto LAB_00111ffe;
  goto LAB_00111e56;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }